

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall
pbrt::DisplayItem::DisplayItem
          (DisplayItem *this,string *baseTitle,Point2i resolution,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channelNames,
          function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  bool bVar1;
  int *in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ImageChannelBuffer *this_00;
  string *channelName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int nTiles;
  value_type *in_stack_fffffffffffffef8;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_ffffffffffffff08;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_ffffffffffffff10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  ImageChannelBuffer *in_stack_ffffffffffffff70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70 [2];
  int local_60;
  __pid_t local_5c;
  string local_58 [80];
  undefined8 local_8;
  
  *in_RDI = '\0';
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  local_8 = in_RDX;
  std::__cxx11::string::string((string *)args);
  *(undefined8 *)(in_RDI + 0x28) = local_8;
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = (ImageChannelBuffer *)(in_RDI + 0x68);
  std::
  vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ::vector((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
            *)0x4a80ca);
  local_5c = getpid();
  StringPrintf<std::__cxx11::string_const&,int>(in_RDI,args,in_RCX);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_58);
  std::__cxx11::string::~string(local_58);
  local_60 = (((int)local_8 + 0x7f) / 0x80) * ((local_8._4_4_ + 0x7f) / 0x80);
  local_70[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffef8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(local_70);
    in_stack_fffffffffffffef8 = (value_type *)(in_RDI + 0x68);
    ImageChannelBuffer::ImageChannelBuffer
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff58);
    std::
    vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
    ::push_back((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                 *)this_00,in_stack_fffffffffffffef8);
    ImageChannelBuffer::~ImageChannelBuffer(this_00);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_70);
  }
  return;
}

Assistant:

DisplayItem::DisplayItem(
    const std::string &baseTitle, Point2i resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues)
    : resolution(resolution), getTileValues(getTileValues), channelNames(channelNames) {
#ifdef PBRT_IS_WINDOWS
    title = StringPrintf("%s (%d)", baseTitle, GetCurrentThreadId());
#else
    title = StringPrintf("%s (%d)", baseTitle, getpid());
#endif

    int nTiles = ((resolution.x + tileSize - 1) / tileSize) *
                 ((resolution.y + tileSize - 1) / tileSize);

    for (const std::string &channelName : channelNames)
        channelBuffers.push_back(ImageChannelBuffer(channelName, nTiles, title));
}